

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.h
# Opt level: O2

void __thiscall
google::protobuf::internal::ArenaStringPtr::SetAllocated
          (ArenaStringPtr *this,string *default_value,string *value,Arena *arena)

{
  if ((arena == (Arena *)0x0) && (this->ptr_ != default_value)) {
    Destroy(this,default_value,(Arena *)0x0);
    if (value != (string *)0x0) {
      this->ptr_ = value;
      return;
    }
  }
  else if (value != (string *)0x0) {
    this->ptr_ = value;
    if (arena == (Arena *)0x0) {
      return;
    }
    Arena::Own<std::__cxx11::string>(arena,value);
    return;
  }
  this->ptr_ = default_value;
  return;
}

Assistant:

inline void SetAllocated(const ::std::string* default_value,
                           ::std::string* value, Arena* arena) {
    if (arena == NULL && ptr_ != default_value) {
      Destroy(default_value, arena);
    }
    if (value != NULL) {
      ptr_ = value;
      if (arena != NULL) {
        arena->Own(value);
      }
    } else {
      ptr_ = const_cast< ::std::string*>(default_value);
    }
  }